

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_lerp(quaternion *start,quaternion *end,float percent,quaternion *qR)

{
  short sVar1;
  float fVar2;
  float f2;
  float f1;
  quaternion *qR_local;
  float percent_local;
  quaternion *end_local;
  quaternion *start_local;
  
  sVar1 = scalar_equalsf(percent,0.0);
  if (sVar1 == 0) {
    sVar1 = scalar_equalsf(percent,1.0);
    if (sVar1 == 0) {
      fVar2 = 1.0 - percent;
      (qR->field_0).q[3] = fVar2 * (start->field_0).q[3] + percent * (end->field_0).q[3];
      (qR->field_0).q[0] = fVar2 * (start->field_0).q[0] + percent * (end->field_0).q[0];
      (qR->field_0).q[1] = fVar2 * (start->field_0).q[1] + percent * (end->field_0).q[1];
      (qR->field_0).q[2] = fVar2 * (start->field_0).q[2] + percent * (end->field_0).q[2];
    }
    else {
      quaternion_set(qR,end);
    }
  }
  else {
    quaternion_set(qR,start);
  }
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_lerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT f1, f2;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	f1 = 1.0f - percent;
	f2 = percent;

	/* this expanded form avoids calling quaternion_multiply and
	 * quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}